

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  void **ppvVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  opj_tcd *poVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_image_comp_t *poVar10;
  bool bVar11;
  OPJ_INT32 OVar12;
  OPJ_UINT32 OVar13;
  OPJ_BOOL OVar14;
  OPJ_UINT32 p_src_length;
  int iVar15;
  uint uVar16;
  OPJ_BYTE *pOVar17;
  uint uVar18;
  opj_image_comp_t *in_RCX;
  int iVar19;
  opj_image_t *poVar20;
  OPJ_UINT32 OVar21;
  int iVar22;
  OPJ_UINT32 p_tile_index;
  OPJ_INT32 *pOVar23;
  uint uVar24;
  long lVar25;
  opj_tcd *poVar26;
  long lVar27;
  OPJ_BYTE *pOVar28;
  ulong uVar29;
  OPJ_BYTE *local_78;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x278e,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x278f,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2790,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  poVar8 = p_j2k->m_tcd;
  OVar13 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  bVar11 = true;
  if (OVar13 == 1) {
    in_RCX = (opj_image_comp_t *)poVar8->image;
    ppvVar1 = (void **)&in_RCX->x0;
    bVar11 = false;
    if ((ulong)*(uint *)ppvVar1 != 0) {
      in_RCX = *(opj_image_comp_t **)&in_RCX->prec;
      bVar11 = true;
      lVar25 = 0;
      do {
        if (((byte)*(code *)((long)&in_RCX->data + lVar25) & 0xf) != 0) {
          bVar11 = false;
        }
        lVar25 = lVar25 + 0x40;
      } while ((ulong)*(uint *)ppvVar1 << 6 != lVar25);
      bVar11 = !bVar11;
    }
  }
  if (OVar13 == 0) {
    local_78 = (OPJ_BYTE *)0x0;
  }
  else {
    p_tile_index = 0;
    OVar21 = 0;
    local_78 = (OPJ_BYTE *)0x0;
    do {
      OVar14 = opj_j2k_pre_write_tile
                         (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                          (opj_event_mgr_t *)in_RCX);
      if (OVar14 == 0) {
LAB_0010f69d:
        OVar14 = 0;
        goto LAB_0010f69f;
      }
      poVar26 = p_j2k->m_tcd;
      if (poVar26->image->numcomps != 0) {
        lVar25 = 0;
        uVar29 = 0;
        do {
          poVar9 = poVar8->tcd_image->tiles->comps;
          if (bVar11) {
            OVar14 = opj_alloc_tile_component_data
                               ((opj_tcd_tilecomp_t *)((long)&poVar9->x0 + lVar25));
            if (OVar14 == 0) {
              OVar14 = 0;
              opj_event_msg(p_manager,1,"Error allocating tile component data.");
              goto LAB_0010f69f;
            }
          }
          else {
            *(undefined8 *)((long)&poVar9->data + lVar25) =
                 *(undefined8 *)((long)&poVar8->image->comps->data + lVar25);
            *(undefined4 *)((long)&poVar9->ownsData + lVar25) = 0;
          }
          uVar29 = uVar29 + 1;
          poVar26 = p_j2k->m_tcd;
          lVar25 = lVar25 + 0x40;
        } while (uVar29 < poVar26->image->numcomps);
      }
      p_src_length = opj_tcd_get_encoded_tile_size(poVar26);
      if (bVar11) {
        if (OVar21 < p_src_length) {
          pOVar17 = (OPJ_BYTE *)opj_realloc(local_78,(ulong)p_src_length);
          pOVar28 = pOVar17;
          OVar2 = p_src_length;
          if (pOVar17 == (OPJ_BYTE *)0x0) {
            if (local_78 != (OPJ_BYTE *)0x0) {
              opj_free(local_78);
            }
            opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
            pOVar28 = local_78;
            OVar2 = OVar21;
          }
          OVar21 = OVar2;
          local_78 = pOVar28;
          if (pOVar17 == (OPJ_BYTE *)0x0) {
            return 0;
          }
        }
        poVar26 = p_j2k->m_tcd;
        poVar20 = poVar26->image;
        if (poVar20->numcomps != 0) {
          uVar29 = 0;
          pOVar28 = local_78;
          do {
            poVar10 = poVar20->comps;
            OVar2 = poVar10[uVar29].dx;
            iVar22 = ((poVar10[uVar29].prec >> 3) + 1) - (uint)((poVar10[uVar29].prec & 7) == 0);
            if (iVar22 == 3) {
              iVar22 = 4;
            }
            if ((OVar2 == 0) || (OVar3 = poVar10[uVar29].dy, OVar3 == 0)) {
              __assert_fail("b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                            ,0x78,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
            }
            poVar9 = poVar26->tcd_image->tiles->comps;
            iVar4 = poVar9[uVar29].x1;
            iVar5 = poVar9[uVar29].x0;
            iVar6 = poVar9[uVar29].y0;
            iVar7 = poVar9[uVar29].y1;
            iVar19 = iVar4 - iVar5;
            iVar15 = (int)(~poVar20->x0 + OVar2 + poVar20->x1) / (int)OVar2;
            uVar18 = iVar7 - iVar6;
            in_RCX = (opj_image_comp_t *)(ulong)uVar18;
            uVar16 = iVar15 - iVar19;
            pOVar23 = poVar10[uVar29].data +
                      (uint)((iVar6 - (int)(OVar3 + poVar20->y0 + -1) / (int)OVar3) * iVar15 +
                            (iVar5 - (int)(OVar2 + poVar20->x0 + -1) / (int)OVar2));
            if (iVar22 == 1) {
              if (poVar10[uVar29].sgnd == 0) {
                if (iVar7 != iVar6) {
                  uVar24 = 0;
                  do {
                    iVar22 = iVar19;
                    if (iVar4 != iVar5) {
                      do {
                        *pOVar28 = (OPJ_BYTE)*pOVar23;
                        pOVar28 = pOVar28 + 1;
                        pOVar23 = pOVar23 + 1;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    pOVar23 = pOVar23 + uVar16;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar18);
                }
              }
              else if (iVar7 != iVar6) {
                uVar24 = 0;
                do {
                  iVar22 = iVar19;
                  if (iVar4 != iVar5) {
                    do {
                      *pOVar28 = (OPJ_BYTE)*pOVar23;
                      pOVar28 = pOVar28 + 1;
                      pOVar23 = pOVar23 + 1;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  pOVar23 = pOVar23 + uVar16;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar18);
              }
            }
            else if (iVar22 == 2) {
              if (poVar10[uVar29].sgnd == 0) {
                if (iVar7 != iVar6) {
                  uVar24 = 0;
                  do {
                    iVar22 = iVar19;
                    if (iVar4 != iVar5) {
                      do {
                        OVar12 = *pOVar23;
                        pOVar23 = pOVar23 + 1;
                        *(short *)pOVar28 = (short)OVar12;
                        pOVar28 = pOVar28 + 2;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    pOVar23 = pOVar23 + uVar16;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar18);
                }
              }
              else if (iVar7 != iVar6) {
                uVar24 = 0;
                do {
                  iVar22 = iVar19;
                  if (iVar4 != iVar5) {
                    do {
                      OVar12 = *pOVar23;
                      pOVar23 = pOVar23 + 1;
                      *(short *)pOVar28 = (short)OVar12;
                      pOVar28 = pOVar28 + 2;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  pOVar23 = pOVar23 + uVar16;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar18);
              }
            }
            else if ((iVar22 == 4) && (iVar7 != iVar6)) {
              uVar24 = 0;
              do {
                if (iVar4 != iVar5) {
                  lVar27 = 0;
                  lVar25 = 0;
                  do {
                    *(OPJ_INT32 *)(pOVar28 + lVar25 * 4) = pOVar23[lVar25];
                    lVar25 = lVar25 + 1;
                    lVar27 = lVar27 + -4;
                  } while (iVar19 != (int)lVar25);
                  pOVar28 = pOVar28 + -lVar27;
                  pOVar23 = (OPJ_INT32 *)((long)pOVar23 - lVar27);
                }
                pOVar23 = pOVar23 + uVar16;
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar18);
            }
            uVar29 = uVar29 + 1;
            poVar20 = poVar26->image;
          } while (uVar29 < poVar20->numcomps);
        }
        OVar14 = opj_tcd_copy_tile_data(p_j2k->m_tcd,local_78,p_src_length);
        if (OVar14 == 0) {
          OVar14 = 0;
          opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
          goto LAB_0010f6a9;
        }
      }
      OVar14 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
      if (OVar14 == 0) goto LAB_0010f69d;
      p_tile_index = p_tile_index + 1;
    } while (p_tile_index != OVar13);
  }
  OVar14 = 1;
LAB_0010f69f:
  if (local_78 != (OPJ_BYTE *)0x0) {
LAB_0010f6a9:
    opj_free(local_78);
  }
  return OVar14;
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 i, j;
        OPJ_UINT32 l_nb_tiles;
        OPJ_UINT32 l_max_tile_size = 0, l_current_tile_size;
        OPJ_BYTE * l_current_data = 00;
        OPJ_BOOL l_reuse_data = OPJ_FALSE;
        opj_tcd_t* p_tcd = 00;

        /* preconditions */
        assert(p_j2k != 00);
        assert(p_stream != 00);
        assert(p_manager != 00);
	
        p_tcd = p_j2k->m_tcd;

        l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        if (l_nb_tiles == 1) {
                l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                        if (((size_t)l_img_comp->data & 0xFU) != 0U) { /* tile data shall be aligned on 16 bytes */
												        l_reuse_data = OPJ_FALSE;
                        }
                }
#endif
        }
        for (i=0;i<l_nb_tiles;++i) {
                if (! opj_j2k_pre_write_tile(p_j2k,i,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }

                /* if we only have one tile, then simply set tile component data equal to image component data */
                /* otherwise, allocate the data */
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
                        if (l_reuse_data) {
												        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
												        l_tilec->data  =  l_img_comp->data;
												        l_tilec->ownsData = OPJ_FALSE;
                        } else {
												        if(! opj_alloc_tile_component_data(l_tilec)) {
												                opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data." );
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                return OPJ_FALSE;
												        }
                        }
                }
                l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
                if (!l_reuse_data) {
                        if (l_current_tile_size > l_max_tile_size) {
												        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_current_tile_size);
												        if (! l_new_current_data) {
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
												                return OPJ_FALSE;
																}
																l_current_data = l_new_current_data;
																l_max_tile_size = l_current_tile_size;
                        }

                        /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
                        /* 32 bit components @ 8 bit precision get converted to 8 bit */
                        /* 32 bit components @ 16 bit precision get converted to 16 bit */
                        opj_j2k_get_tile_data(p_j2k->m_tcd,l_current_data);

                        /* now copy this data into the tile component */
                        if (! opj_tcd_copy_tile_data(p_j2k->m_tcd,l_current_data,l_current_tile_size)) {
																opj_event_msg(p_manager, EVT_ERROR, "Size mismatch between tile data and sent data." );
																opj_free(l_current_data);
																return OPJ_FALSE;
                        }
                }

                if (! opj_j2k_post_write_tile (p_j2k,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }
        }

        if (l_current_data) {
                opj_free(l_current_data);
        }
        return OPJ_TRUE;
}